

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O0

int nn_sock_getopt_inner(nn_sock *self,int level,int option,void *optval,size_t *optvallen)

{
  int iVar1;
  size_t sVar2;
  size_t local_80;
  size_t local_70;
  size_t local_60;
  nn_fd local_48;
  int local_44;
  nn_fd fd;
  int intval;
  nn_optset *optset;
  size_t *psStack_30;
  int rc;
  size_t *optvallen_local;
  void *optval_local;
  int option_local;
  int level_local;
  nn_sock *self_local;
  
  psStack_30 = optvallen;
  optvallen_local = (size_t *)optval;
  optval_local._0_4_ = option;
  optval_local._4_4_ = level;
  _option_local = self;
  if (level == 0) {
    switch(option) {
    case 1:
      local_44 = self->linger;
      break;
    case 2:
      local_44 = self->sndbuf;
      break;
    case 3:
      local_44 = self->rcvbuf;
      break;
    case 4:
      local_44 = self->sndtimeo;
      break;
    case 5:
      local_44 = self->rcvtimeo;
      break;
    case 6:
      local_44 = self->reconnect_ivl;
      break;
    case 7:
      local_44 = self->reconnect_ivl_max;
      break;
    case 8:
      local_44 = (self->ep_template).sndprio;
      break;
    case 9:
      local_44 = (self->ep_template).rcvprio;
      break;
    case 10:
      if ((self->socktype->flags & 2U) != 0) {
        return -0x5c;
      }
      local_48 = nn_efd_getfd(&self->sndfd);
      if (*psStack_30 < 4) {
        local_60 = *psStack_30;
      }
      else {
        local_60 = 4;
      }
      memcpy(optvallen_local,&local_48,local_60);
      *psStack_30 = 4;
      return 0;
    case 0xb:
      if ((self->socktype->flags & 1U) != 0) {
        return -0x5c;
      }
      local_48 = nn_efd_getfd(&self->rcvfd);
      if (*psStack_30 < 4) {
        local_70 = *psStack_30;
      }
      else {
        local_70 = 4;
      }
      memcpy(optvallen_local,&local_48,local_70);
      *psStack_30 = 4;
      return 0;
    case 0xc:
      local_44 = self->socktype->domain;
      break;
    case 0xd:
      local_44 = self->socktype->protocol;
      break;
    case 0xe:
      local_44 = (self->ep_template).ipv4only;
      break;
    case 0xf:
      strncpy((char *)optval,self->socket_name,*optvallen);
      sVar2 = strlen(_option_local->socket_name);
      *psStack_30 = sVar2;
      return 0;
    case 0x10:
      local_44 = self->rcvmaxsize;
      break;
    default:
      return -0x5c;
    }
    if (*optvallen < 4) {
      local_80 = *optvallen;
    }
    else {
      local_80 = 4;
    }
    memcpy(optval,&local_44,local_80);
    *psStack_30 = 4;
    return 0;
  }
  if (0 < level) {
    iVar1 = (*self->sockbase->vfptr->getopt)(self->sockbase,level,option,optval,optvallen);
    return iVar1;
  }
  if (level < 0) {
    _fd = nn_sock_optset(self,level);
    if (_fd == (nn_optset *)0x0) {
      return -0x5c;
    }
    iVar1 = (*_fd->vfptr->getopt)(_fd,(int)optval_local,optvallen_local,psStack_30);
    return iVar1;
  }
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","0",
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/core/sock.c",
          0x1fc);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

int nn_sock_getopt_inner (struct nn_sock *self, int level,
    int option, void *optval, size_t *optvallen)
{
    int rc;
    struct nn_optset *optset;
    int intval;
    nn_fd fd;

    /*  Generic socket-level options. */
    if (level == NN_SOL_SOCKET) {
        switch (option) {
        case NN_DOMAIN:
            intval = self->socktype->domain;
            break;
        case NN_PROTOCOL:
            intval = self->socktype->protocol;
            break;
        case NN_LINGER:
            intval = self->linger;
            break;
        case NN_SNDBUF:
            intval = self->sndbuf;
            break;
        case NN_RCVBUF:
            intval = self->rcvbuf;
            break;
        case NN_RCVMAXSIZE:
            intval = self->rcvmaxsize;
            break;
        case NN_SNDTIMEO:
            intval = self->sndtimeo;
            break;
        case NN_RCVTIMEO:
            intval = self->rcvtimeo;
            break;
        case NN_RECONNECT_IVL:
            intval = self->reconnect_ivl;
            break;
        case NN_RECONNECT_IVL_MAX:
            intval = self->reconnect_ivl_max;
            break;
        case NN_SNDPRIO:
            intval = self->ep_template.sndprio;
            break;
        case NN_RCVPRIO:
            intval = self->ep_template.rcvprio;
            break;
        case NN_IPV4ONLY:
            intval = self->ep_template.ipv4only;
            break;
        case NN_SNDFD:
            if (self->socktype->flags & NN_SOCKTYPE_FLAG_NOSEND)
                return -ENOPROTOOPT;
            fd = nn_efd_getfd (&self->sndfd);
            memcpy (optval, &fd,
                *optvallen < sizeof (nn_fd) ? *optvallen : sizeof (nn_fd));
            *optvallen = sizeof (nn_fd);
            return 0;
        case NN_RCVFD:
            if (self->socktype->flags & NN_SOCKTYPE_FLAG_NORECV)
                return -ENOPROTOOPT;
            fd = nn_efd_getfd (&self->rcvfd);
            memcpy (optval, &fd,
                *optvallen < sizeof (nn_fd) ? *optvallen : sizeof (nn_fd));
            *optvallen = sizeof (nn_fd);
            return 0;
        case NN_SOCKET_NAME:
            strncpy (optval, self->socket_name, *optvallen);
            *optvallen = strlen(self->socket_name);
            return 0;
        default:
            return -ENOPROTOOPT;
        }

        memcpy (optval, &intval,
            *optvallen < sizeof (int) ? *optvallen : sizeof (int));
        *optvallen = sizeof (int);

        return 0;
    }

    /*  Protocol-specific socket options. */
    if (level > NN_SOL_SOCKET)
        return rc = self->sockbase->vfptr->getopt (self->sockbase,
            level, option, optval, optvallen);

    /*  Transport-specific options. */
    if (level < NN_SOL_SOCKET) {
        optset = nn_sock_optset (self, level);
        if (!optset)
            return -ENOPROTOOPT;
        return optset->vfptr->getopt (optset, option, optval, optvallen);
    }

    nn_assert (0);
}